

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

void plutovg_canvas_stroke_extents(plutovg_canvas_t *canvas,plutovg_rect_t *extents)

{
  plutovg_state_t *ppVar1;
  float local_30;
  float local_28;
  float delta;
  float join_limit;
  float cap_limit;
  plutovg_stroke_data_t *stroke;
  plutovg_rect_t *extents_local;
  plutovg_canvas_t *canvas_local;
  
  ppVar1 = canvas->state;
  delta = (ppVar1->stroke).style.width / 2.0;
  if ((ppVar1->stroke).style.cap == PLUTOVG_LINE_CAP_SQUARE) {
    delta = delta * 1.4142135;
  }
  local_28 = (ppVar1->stroke).style.width / 2.0;
  if ((ppVar1->stroke).style.join == PLUTOVG_LINE_JOIN_MITER) {
    local_28 = (ppVar1->stroke).style.miter_limit * local_28;
  }
  if (delta <= local_28) {
    local_30 = local_28;
  }
  else {
    local_30 = delta;
  }
  plutovg_path_extents(canvas->path,extents,true);
  extents->x = extents->x - local_30;
  extents->y = extents->y - local_30;
  extents->w = local_30 + local_30 + extents->w;
  extents->h = local_30 + local_30 + extents->h;
  plutovg_canvas_map_rect(canvas,extents,extents);
  return;
}

Assistant:

void plutovg_canvas_stroke_extents(const plutovg_canvas_t* canvas, plutovg_rect_t* extents)
{
    plutovg_stroke_data_t* stroke = &canvas->state->stroke;
    float cap_limit = stroke->style.width / 2.f;
    if(stroke->style.cap == PLUTOVG_LINE_CAP_SQUARE)
        cap_limit *= PLUTOVG_SQRT2;
    float join_limit = stroke->style.width / 2.f;
    if(stroke->style.join == PLUTOVG_LINE_JOIN_MITER) {
        join_limit *= stroke->style.miter_limit;
    }

    float delta = plutovg_max(cap_limit, join_limit);
    plutovg_path_extents(canvas->path, extents, true);
    extents->x -= delta;
    extents->y -= delta;
    extents->w += delta * 2.f;
    extents->h += delta * 2.f;
    plutovg_canvas_map_rect(canvas, extents, extents);
}